

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cc
# Opt level: O2

__pid_t __thiscall muduo::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  
  MutexLock::lock(&this->mutex_);
  while (0 < this->count_) {
    Condition::wait(&this->condition_,__stat_loc);
  }
  MutexLock::unlock(&this->mutex_);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait()
{
  MutexLockGuard lock(mutex_);
  while (count_ > 0)
  {
    condition_.wait();
  }
}